

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Aig_Man_t *
Aig_ManChoicePartitioned(Vec_Ptr_t *vAigs,int nPartSize,int nConfMax,int nLevelMax,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *pAVar7;
  Vec_Ptr_t *p;
  long *plVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *vPart;
  Aig_Man_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  void *pvVar12;
  undefined8 *puVar13;
  Tim_Man_t *pTVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint i;
  long lVar18;
  int iVar19;
  int iVar20;
  
  iVar20 = vAigs->nSize;
  if (iVar20 < 2) {
    __assert_fail("Vec_PtrSize(vAigs) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPart.c"
                  ,0x4ed,"Aig_Man_t *Aig_ManChoicePartitioned(Vec_Ptr_t *, int, int, int, int)");
  }
  iVar17 = 0;
  for (iVar19 = 0; iVar19 < iVar20; iVar19 = iVar19 + 1) {
    pvVar4 = Vec_PtrEntry(vAigs,iVar19);
    iVar17 = iVar17 + *(int *)(*(long *)((long)pvVar4 + 0x20) + 4);
    iVar20 = vAigs->nSize;
  }
  pAVar5 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
  pVVar6 = Aig_ManPartitionSmart(pAVar5,nPartSize,0,(Vec_Ptr_t **)0x0);
  pAVar7 = Aig_ManStartFrom(pAVar5);
  Aig_ManReprStart(pAVar7,iVar17);
  p = Vec_PtrStart(pAVar5->nObjs[3]);
  for (iVar20 = 0; iVar20 < vAigs->nSize; iVar20 = iVar20 + 1) {
    pvVar4 = Vec_PtrEntry(vAigs,iVar20);
    for (lVar18 = 0; lVar18 < (*(Vec_Ptr_t **)((long)pvVar4 + 0x10))->nSize; lVar18 = lVar18 + 1) {
      plVar8 = (long *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar4 + 0x10),(int)lVar18);
      *plVar8 = lVar18;
    }
  }
  p_00 = Vec_IntAlloc(100);
  uVar1 = pVVar6->nSize;
  uVar15 = 0;
  if (0 < (int)uVar1) {
    uVar15 = uVar1;
  }
  i = 0;
  do {
    if (i == uVar15) {
      if (fVerbose != 0) {
        printf(
              "                                                                                          \r"
              );
      }
      Vec_VecFree((Vec_Vec_t *)pVVar6);
      Vec_IntFree(p_00);
      for (iVar20 = 0; iVar20 < vAigs->nSize; iVar20 = iVar20 + 1) {
        pvVar4 = Vec_PtrEntry(vAigs,iVar20);
        for (iVar17 = 0; iVar17 < (*(Vec_Ptr_t **)((long)pvVar4 + 0x10))->nSize; iVar17 = iVar17 + 1
            ) {
          puVar13 = (undefined8 *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar4 + 0x10),iVar17);
          *puVar13 = 0;
        }
      }
      iVar20 = p->nSize;
      iVar17 = 0;
      if (iVar20 < 1) {
        iVar20 = 0;
        iVar17 = 0;
      }
      for (; iVar20 != iVar17; iVar17 = iVar17 + 1) {
        pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar17);
        Aig_ObjCreateCo(pAVar7,pAVar11);
      }
      Vec_PtrFree(p);
      pAVar5 = Aig_ManRehash(pAVar7);
      Aig_ManMarkValidChoices(pAVar5);
      pAVar7 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
      pVVar6 = Aig_ManOrderPios(pAVar5,pAVar7);
      pAVar7 = Aig_ManDupDfsGuided(pAVar5,pVVar6);
      Aig_ManStop(pAVar5);
      Vec_PtrFree(pVVar6);
      pvVar4 = Vec_PtrEntry(vAigs,0);
      if (*(Tim_Man_t **)((long)pvVar4 + 0x160) != (Tim_Man_t *)0x0) {
        pTVar14 = Tim_ManDup(*(Tim_Man_t **)((long)pvVar4 + 0x160),0);
        pAVar7->pManTime = pTVar14;
      }
      Aig_ManChoiceLevel(pAVar7);
      return pAVar7;
    }
    vPart = (Vec_Int_t *)Vec_PtrEntry(pVVar6,i);
    pAVar5 = Aig_ManStart(5000);
    p_00->nSize = 0;
    for (iVar20 = 0; iVar20 < vAigs->nSize; iVar20 = iVar20 + 1) {
      pAVar9 = (Aig_Man_t *)Vec_PtrEntry(vAigs,iVar20);
      pVVar10 = Aig_ManDupPart(pAVar5,pAVar9,vPart,p_00,0);
      if (iVar20 == 0) {
        iVar19 = 0;
        iVar17 = pVVar10->nSize;
        if (pVVar10->nSize < 1) {
          iVar17 = iVar19;
        }
        for (; iVar17 != iVar19; iVar19 = iVar19 + 1) {
          pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(pVVar10,iVar19);
          Aig_ObjCreateCo(pAVar5,pAVar11);
        }
      }
      Vec_PtrFree(pVVar10);
    }
    pVVar10 = Aig_ManDupPart(pAVar7,pAVar5,vPart,p_00,1);
    iVar20 = pVVar10->nSize;
    iVar17 = 0;
    if (iVar20 < 1) {
      iVar20 = 0;
      iVar17 = 0;
    }
    for (; iVar20 != iVar17; iVar17 = iVar17 + 1) {
      pvVar4 = Vec_PtrEntry(pVVar10,iVar17);
      iVar19 = Vec_IntEntry(vPart,iVar17);
      pvVar12 = Vec_PtrEntry(p,iVar19);
      if (pvVar12 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry( vOutsTotal, Vec_IntEntry(vPart,k) ) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPart.c"
                      ,0x51b,"Aig_Man_t *Aig_ManChoicePartitioned(Vec_Ptr_t *, int, int, int, int)")
        ;
      }
      iVar19 = Vec_IntEntry(vPart,iVar17);
      Vec_PtrWriteEntry(p,iVar19,pvVar4);
    }
    Vec_PtrFree(pVVar10);
    pVVar10 = pAVar5->vObjs;
    uVar16 = (ulong)pVVar10->nSize;
    pvVar4 = malloc(uVar16 << 3);
    for (lVar18 = 0; lVar18 < (int)uVar16; lVar18 = lVar18 + 1) {
      pvVar12 = Vec_PtrEntry(pVVar10,(int)lVar18);
      if (pvVar12 != (void *)0x0) {
        *(undefined8 *)((long)pvVar4 + lVar18 * 8) = *(undefined8 *)((long)pvVar12 + 0x28);
      }
      pVVar10 = pAVar5->vObjs;
      uVar16 = (ulong)(uint)pVVar10->nSize;
    }
    if (fVerbose != 0) {
      iVar20 = pAVar5->nObjs[2];
      uVar2 = pAVar5->nObjs[3];
      iVar17 = pAVar5->nObjs[6];
      iVar19 = pAVar5->nObjs[5];
      iVar3 = Aig_ManLevelNum(pAVar5);
      printf("Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",(ulong)(i + 1),
             (ulong)uVar1,iVar20,(ulong)uVar2,(ulong)(uint)(iVar17 + iVar19),iVar3);
    }
    pAVar9 = Fra_FraigChoice(pAVar5,nConfMax,nLevelMax);
    Aig_ManStop(pAVar9);
    for (lVar18 = 0; lVar18 < pAVar5->vObjs->nSize; lVar18 = lVar18 + 1) {
      pvVar12 = Vec_PtrEntry(pAVar5->vObjs,(int)lVar18);
      if (pvVar12 != (void *)0x0) {
        *(undefined8 *)((long)pvVar12 + 0x28) = *(undefined8 *)((long)pvVar4 + lVar18 * 8);
      }
    }
    free(pvVar4);
    if (pAVar5->pReprs != (Aig_Obj_t **)0x0) {
      Aig_ManTransferRepr(pAVar7,pAVar5);
    }
    Aig_ManStop(pAVar5);
    i = i + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManChoicePartitioned( Vec_Ptr_t * vAigs, int nPartSize, int nConfMax, int nLevelMax, int fVerbose )
{
//    extern int Cmd_CommandExecute( void * pAbc, char * sCommand );
//    extern void * Abc_FrameGetGlobalFrame();
//    extern Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax );

    Vec_Ptr_t * vPios;
    Vec_Ptr_t * vOutsTotal, * vOuts;
    Aig_Man_t * pAigTotal, * pAigPart, * pAig, * pTemp;
    Vec_Int_t * vPart, * vPartSupp;
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    void ** ppData;
    int i, k, m, nIdMax;
    assert( Vec_PtrSize(vAigs) > 1 );

    // compute the total number of IDs
    nIdMax = 0;
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        nIdMax += Aig_ManObjNumMax(pAig);

    // partition the first AIG in the array
    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    vParts = Aig_ManPartitionSmart( pAig, nPartSize, 0, NULL );

    // start the total fraiged AIG
    pAigTotal = Aig_ManStartFrom( pAig );
    Aig_ManReprStart( pAigTotal, nIdMax );
    vOutsTotal = Vec_PtrStart( Aig_ManCoNum(pAig) );

    // set the PI numbers
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        Aig_ManForEachCi( pAig, pObj, k )
            pObj->pNext = (Aig_Obj_t *)(long)k;

//    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // create the total fraiged AIG
    vPartSupp = Vec_IntAlloc( 100 ); // maps part PI num into total PI num
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        // derive the partition AIG
        pAigPart = Aig_ManStart( 5000 );
//        pAigPart->pName = Extra_UtilStrsav( pAigPart->pName );
        Vec_IntClear( vPartSupp );
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, k )
        {
            vOuts = Aig_ManDupPart( pAigPart, pAig, vPart, vPartSupp, 0 );
            if ( k == 0 )
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, m )
                    Aig_ObjCreateCo( pAigPart, pObj );
            }
            Vec_PtrFree( vOuts );
        }
        // derive the total AIG from the partitioned AIG
        vOuts = Aig_ManDupPart( pAigTotal, pAigPart, vPart, vPartSupp, 1 );
        // add to the outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
        {
            assert( Vec_PtrEntry( vOutsTotal, Vec_IntEntry(vPart,k) ) == NULL );
            Vec_PtrWriteEntry( vOutsTotal, Vec_IntEntry(vPart,k), pObj );
        }
        Vec_PtrFree( vOuts );
        // store contents of pData pointers
        ppData = ABC_ALLOC( void *, Aig_ManObjNumMax(pAigPart) );
        Aig_ManForEachObj( pAigPart, pObj, k )
            ppData[k] = pObj->pData;
        // report the process
        if ( fVerbose )
        printf( "Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), 
            Aig_ManNodeNum(pAigPart), Aig_ManLevelNum(pAigPart) );
        // compute equivalence classes (to be stored in pNew->pReprs)
        pAig = Fra_FraigChoice( pAigPart, nConfMax, nLevelMax );
        Aig_ManStop( pAig );
        // reset the pData pointers
        Aig_ManForEachObj( pAigPart, pObj, k )
            pObj->pData = ppData[k];
        ABC_FREE( ppData );
        // transfer representatives to the total AIG
        if ( pAigPart->pReprs )
            Aig_ManTransferRepr( pAigTotal, pAigPart );
        Aig_ManStop( pAigPart );
    }
    if ( fVerbose )
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_IntFree( vPartSupp );

//    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // clear the PI numbers
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        Aig_ManForEachCi( pAig, pObj, k )
            pObj->pNext = NULL;

    // add the outputs in the same order
    Vec_PtrForEachEntry( Aig_Obj_t *, vOutsTotal, pObj, i )
        Aig_ObjCreateCo( pAigTotal, pObj );
    Vec_PtrFree( vOutsTotal );

    // derive the result of choicing
    pAig = Aig_ManRehash( pAigTotal );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pAig );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pAig, (Aig_Man_t *)Vec_PtrEntry(vAigs,0) );
    pAig = Aig_ManDupDfsGuided( pTemp = pAig, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pAig->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pAig );
    return pAig;
}